

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zarray.h
# Opt level: O0

void zarray_ensure_capacity(zarray_t *za,int capacity)

{
  char *pcVar1;
  int capacity_local;
  zarray_t *za_local;
  
  if (za == (zarray_t *)0x0) {
    __assert_fail("za != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zarray.h"
                  ,0xa0,"void zarray_ensure_capacity(zarray_t *, int)");
  }
  if (za->alloc < capacity) {
    while (za->alloc < capacity) {
      za->alloc = za->alloc << 1;
      if (za->alloc < 8) {
        za->alloc = 8;
      }
    }
    pcVar1 = (char *)realloc(za->data,(long)za->alloc * za->el_sz);
    za->data = pcVar1;
  }
  return;
}

Assistant:

static inline void zarray_ensure_capacity(zarray_t *za, int capacity)
{
    assert(za != NULL);

    if (capacity <= za->alloc)
        return;

    while (za->alloc < capacity) {
        za->alloc *= 2;
        if (za->alloc < 8)
            za->alloc = 8;
    }

    za->data = (char*) realloc(za->data, za->alloc * za->el_sz);
}